

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

void event_queue_remove_active_later(event_base *base,event_callback *evcb)

{
  int iVar1;
  event_callback *evcb_local;
  event_base *base_local;
  
  if (((base->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) &&
     (iVar1 = evthread_is_debug_lock_held_(base->th_base_lock), iVar1 == 0)) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,0xcb9,"evthread_is_debug_lock_held_((base)->th_base_lock)",
               "event_queue_remove_active_later");
  }
  if ((evcb->evcb_flags & 0x20U) != 0) {
    base->event_count = base->event_count - (uint)(((evcb->evcb_flags & 0x10U) != 0 ^ 0xffU) & 1);
    evcb->evcb_flags = evcb->evcb_flags & 0xffdf;
    base->event_count_active = base->event_count_active + -1;
    if ((evcb->evcb_active_next).tqe_next == (event_callback *)0x0) {
      (base->active_later_queue).tqh_last = (evcb->evcb_active_next).tqe_prev;
    }
    else {
      (((evcb->evcb_active_next).tqe_next)->evcb_active_next).tqe_prev =
           (evcb->evcb_active_next).tqe_prev;
    }
    *(evcb->evcb_active_next).tqe_prev = (evcb->evcb_active_next).tqe_next;
    return;
  }
  event_errx(1,"%s: %p not on queue %x","event_queue_remove_active_later",evcb,0x20);
}

Assistant:

static void
event_queue_remove_active_later(struct event_base *base, struct event_callback *evcb)
{
	EVENT_BASE_ASSERT_LOCKED(base);
	if (EVUTIL_FAILURE_CHECK(!(evcb->evcb_flags & EVLIST_ACTIVE_LATER))) {
		event_errx(1, "%s: %p not on queue %x", __func__,
			   evcb, EVLIST_ACTIVE_LATER);
		return;
	}
	DECR_EVENT_COUNT(base, evcb->evcb_flags);
	evcb->evcb_flags &= ~EVLIST_ACTIVE_LATER;
	base->event_count_active--;

	TAILQ_REMOVE(&base->active_later_queue, evcb, evcb_active_next);
}